

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O2

Window * __thiscall
s2polyline_alignment::Window::Upsample
          (Window *__return_storage_ptr__,Window *this,int new_rows,int new_cols)

{
  ColumnStride CVar1;
  pointer pCVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  ColumnStride CVar7;
  allocator_type local_59;
  double local_58;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  new_strides;
  
  if (new_rows < this->rows_) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&new_strides,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x46,kFatal,(ostream *)&std::cerr);
    poVar3 = std::operator<<((ostream *)
                             new_strides.
                             super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             "Check failed: new_rows >= rows_ ");
    std::operator<<(poVar3,"Upsampling: New_rows < current_rows");
  }
  else {
    if (this->cols_ <= new_cols) {
      local_58 = (double)new_rows / (double)this->rows_;
      dVar6 = (double)new_cols / (double)this->cols_;
      std::
      vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
      ::vector(&new_strides,(long)new_rows,&local_59);
      pCVar2 = (this->strides_).
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = 0;
      uVar5 = (ulong)(uint)new_rows;
      if (new_rows < 1) {
        uVar5 = uVar4;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        CVar1 = pCVar2[(int)(((double)(int)uVar4 + 0.5) / local_58)];
        CVar7.start = (int)((double)CVar1.start * dVar6 + 0.5);
        CVar7.end = (int)((double)CVar1.end * dVar6 + 0.5);
        new_strides.
        super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar4] = CVar7;
      }
      Window(__return_storage_ptr__,&new_strides);
      std::
      _Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
      ::~_Vector_base(&new_strides.
                       super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                     );
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&new_strides,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x47,kFatal,(ostream *)&std::cerr);
    poVar3 = std::operator<<((ostream *)
                             new_strides.
                             super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             "Check failed: new_cols >= cols_ ");
    std::operator<<(poVar3,"Upsampling: New_cols < current_cols");
  }
  abort();
}

Assistant:

Window Window::Upsample(const int new_rows, const int new_cols) const {
  S2_DCHECK(new_rows >= rows_) << "Upsampling: New_rows < current_rows";
  S2_DCHECK(new_cols >= cols_) << "Upsampling: New_cols < current_cols";
  const double row_scale = static_cast<double>(new_rows) / rows_;
  const double col_scale = static_cast<double>(new_cols) / cols_;
  std::vector<ColumnStride> new_strides(new_rows);
  ColumnStride from_stride;
  for (int row = 0; row < new_rows; ++row) {
    from_stride = strides_[static_cast<int>((row + 0.5) / row_scale)];
    new_strides[row] = {static_cast<int>(col_scale * from_stride.start + 0.5),
                        static_cast<int>(col_scale * from_stride.end + 0.5)};
  }
  return Window(new_strides);
}